

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::SFML::SetJoystickLStickThreshold(float threshold)

{
  float threshold_local;
  
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x25c,"void ImGui::SFML::SetJoystickLStickThreshold(float)");
  }
  if (threshold < 0.0 || 100.0 < threshold) {
    __assert_fail("threshold >= 0.f && threshold <= 100.f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x25d,"void ImGui::SFML::SetJoystickLStickThreshold(float)");
  }
  *(float *)((anonymous_namespace)::s_currWindowCtx + 0xc0) = threshold;
  return;
}

Assistant:

void SetJoystickLStickThreshold(float threshold) {
    assert(s_currWindowCtx);
    assert(threshold >= 0.f && threshold <= 100.f);
    s_currWindowCtx->lStickInfo.threshold = threshold;
}